

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PushID(int int_id)

{
  ImGuiWindow *this;
  ImGuiID local_c;
  
  this = GImGui->CurrentWindow;
  local_c = ImGuiWindow::GetIDNoKeepAlive(this,int_id);
  ImVector<unsigned_int>::push_back(&this->IDStack,&local_c);
  return;
}

Assistant:

void ImGui::PushID(int int_id)
{
    ImGuiWindow* window = GImGui->CurrentWindow;
    window->IDStack.push_back(window->GetIDNoKeepAlive(int_id));
}